

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

uint lodepng::invMatrix(float *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  long lVar16;
  float result [9];
  
  fVar1 = m[4];
  fVar2 = m[7];
  fVar3 = m[1];
  fVar8 = (float)*(undefined8 *)(m + 5);
  fVar9 = (float)((ulong)*(undefined8 *)(m + 5) >> 0x20);
  fVar4 = *m;
  fVar5 = m[2];
  fVar6 = m[3];
  fVar7 = m[8];
  fVar14 = fVar1 * fVar7 - fVar8 * fVar2;
  fVar12 = fVar8 * fVar9 - fVar7 * fVar6;
  fVar13 = fVar6 * fVar2 - fVar9 * fVar1;
  fVar10 = 1.0 / (fVar5 * fVar13 + fVar4 * fVar14 + fVar12 * fVar3);
  fVar11 = fVar10;
  if (fVar10 <= -fVar10) {
    fVar11 = -fVar10;
  }
  if (fVar11 <= 1e+15) {
    result[0] = fVar14 * fVar10;
    result[1] = (fVar5 * fVar2 - fVar7 * fVar3) * fVar10;
    result[2] = (fVar8 * fVar3 + -fVar5 * fVar1) * fVar10;
    result[3] = fVar12 * fVar10;
    result[4] = (fVar4 * fVar7 - fVar5 * fVar9) * fVar10;
    result[5] = (fVar6 * fVar5 - fVar4 * fVar8) * fVar10;
    result[6] = fVar13 * fVar10;
    result[7] = (fVar9 * fVar3 + -fVar4 * fVar2) * fVar10;
    result[8] = (fVar1 * fVar4 + -fVar6 * fVar3) * fVar10;
    uVar15 = 0;
    for (lVar16 = 0; lVar16 != 9; lVar16 = lVar16 + 1) {
      m[lVar16] = result[lVar16];
    }
  }
  else {
    uVar15 = 1;
  }
  return uVar15;
}

Assistant:

static unsigned invMatrix(float* m) {
  int i;
  /* double used instead of float for intermediate computations to avoid
  intermediate numerical precision issues */
  double e0 = (double)m[4] * m[8] - (double)m[5] * m[7];
  double e3 = (double)m[5] * m[6] - (double)m[3] * m[8];
  double e6 = (double)m[3] * m[7] - (double)m[4] * m[6];
  /* inverse determinant */
  double d = 1.0 / (m[0] * e0 + m[1] * e3 + m[2] * e6);
  float result[9];
  if((d > 0 ? d : -d) > 1e15) return 1; /* error, likely not invertible */
  result[0] = e0 * d;
  result[1] = ((double)m[2] * m[7] - (double)m[1] * m[8]) * d;
  result[2] = ((double)m[1] * m[5] - (double)m[2] * m[4]) * d;
  result[3] = e3 * d;
  result[4] = ((double)m[0] * m[8] - (double)m[2] * m[6]) * d;
  result[5] = ((double)m[3] * m[2] - (double)m[0] * m[5]) * d;
  result[6] = e6 * d;
  result[7] = ((double)m[6] * m[1] - (double)m[0] * m[7]) * d;
  result[8] = ((double)m[0] * m[4] - (double)m[3] * m[1]) * d;
  for(i = 0; i < 9; i++) m[i] = result[i];
  return 0; /* ok */
}